

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::bitcast_to_builtin_store
          (CompilerGLSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  undefined1 local_1a8 [40];
  SPIRType type;
  BaseType expected_type;
  ID local_2c;
  BuiltIn builtin;
  SPIRType *expr_type_local;
  string *expr_local;
  CompilerGLSL *pCStack_10;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  _builtin = expr_type;
  expr_type_local = (SPIRType *)expr;
  expr_local._4_4_ = target_id;
  pCStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,target_id);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_2c,DecorationBuiltIn);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)
               ((long)&type.member_name_cache._M_h._M_single_bucket + 4),expr_local._4_4_);
    uVar2 = Compiler::get_decoration
                      (&this->super_Compiler,type.member_name_cache._M_h._M_single_bucket._4_4_,
                       DecorationBuiltIn);
    type.member_name_cache._M_h._M_single_bucket._0_4_ =
         *(int *)&(_builtin->super_IVariant).field_0xc;
    if (((uVar2 == 7) || (uVar2 - 9 < 2)) || (uVar2 == 0x1396)) {
      type.member_name_cache._M_h._M_single_bucket._0_4_ = 7;
    }
    if ((int)type.member_name_cache._M_h._M_single_bucket !=
        *(int *)&(_builtin->super_IVariant).field_0xc) {
      SPIRType::SPIRType((SPIRType *)(local_1a8 + 0x20),_builtin);
      type.super_IVariant._vptr_IVariant._4_4_ = (int)type.member_name_cache._M_h._M_single_bucket;
      bitcast_expression((CompilerGLSL *)local_1a8,(SPIRType *)this,
                         (BaseType)(SPIRType *)(local_1a8 + 0x20),
                         (string *)(ulong)*(uint *)&(_builtin->super_IVariant).field_0xc);
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_1a8);
      ::std::__cxx11::string::~string((string *)local_1a8);
      SPIRType::~SPIRType((SPIRType *)(local_1a8 + 0x20));
    }
  }
  return;
}

Assistant:

void CompilerGLSL::bitcast_to_builtin_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
		expected_type = SPIRType::Int;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		auto type = expr_type;
		type.basetype = expected_type;
		expr = bitcast_expression(type, expr_type.basetype, expr);
	}
}